

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O3

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
duckdb::TableIndexList::GetRequiredColumns
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,TableIndexList *this)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  pointer pIVar4;
  pointer puVar5;
  __hashtable *__h;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_00;
  unsigned_long col_id;
  unsigned_long local_40;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    this_00 = (this->indexes).
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->indexes).
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != puVar1) {
      do {
        pIVar4 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (this_00);
        puVar2 = (pIVar4->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar5 = (pIVar4->column_ids).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
          local_40 = *puVar5;
          local_38 = __return_storage_ptr__;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)__return_storage_ptr__,&local_40,&local_38);
        }
        this_00 = this_00 + 1;
      } while (this_00 != puVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

unordered_set<column_t> TableIndexList::GetRequiredColumns() {
	lock_guard<mutex> lock(indexes_lock);
	unordered_set<column_t> column_ids;
	for (auto &index : indexes) {
		for (auto col_id : index->GetColumnIds()) {
			column_ids.insert(col_id);
		}
	}
	return column_ids;
}